

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

int __thiscall zmq::address_t::to_string(address_t *this,string *addr_)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string *in_RSI;
  string *in_RDI;
  stringstream s;
  string *in_stack_00000070;
  tipc_address_t *in_stack_00000078;
  string *in_stack_00000290;
  tcp_address_t *in_stack_00000298;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [64];
  string *in_stack_fffffffffffffeb0;
  ipc_address_t *in_stack_fffffffffffffeb8;
  int local_4;
  
  bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if ((bVar1) && (*(long *)(in_RDI + 0x48) != 0)) {
    local_4 = tcp_address_t::to_string(in_stack_00000298,in_stack_00000290);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if ((bVar1) && (*(long *)(in_RDI + 0x48) != 0)) {
      local_4 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),in_RSI);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((bVar1) && (*(long *)(in_RDI + 0x48) != 0)) {
        local_4 = ipc_address_t::to_string(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if ((bVar1) && (*(long *)(in_RDI + 0x48) != 0)) {
          local_4 = tipc_address_t::to_string(in_stack_00000078,in_stack_00000070);
        }
        else {
          uVar2 = std::__cxx11::string::empty();
          if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
            std::__cxx11::stringstream::stringstream(local_1a0);
            poVar3 = std::operator<<(local_190,in_RDI);
            poVar3 = std::operator<<(poVar3,"://");
            std::operator<<(poVar3,in_RDI + 0x20);
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator=(in_RSI,local_1d0);
            std::__cxx11::string::~string(local_1d0);
            local_4 = 0;
            std::__cxx11::stringstream::~stringstream(local_1a0);
          }
          else {
            std::__cxx11::string::clear();
            local_4 = -1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int zmq::address_t::to_string (std::string &addr_) const
{
    if (protocol == protocol_name::tcp && resolved.tcp_addr)
        return resolved.tcp_addr->to_string (addr_);
    if (protocol == protocol_name::udp && resolved.udp_addr)
        return resolved.udp_addr->to_string (addr_);
#ifdef ZMQ_HAVE_WS
    if (protocol == protocol_name::ws && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#ifdef ZMQ_HAVE_WSS
    if (protocol == protocol_name::wss && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_IPC
    if (protocol == protocol_name::ipc && resolved.ipc_addr)
        return resolved.ipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_TIPC
    if (protocol == protocol_name::tipc && resolved.tipc_addr)
        return resolved.tipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_VMCI
    if (protocol == protocol_name::vmci && resolved.vmci_addr)
        return resolved.vmci_addr->to_string (addr_);
#endif

    if (!protocol.empty () && !address.empty ()) {
        std::stringstream s;
        s << protocol << "://" << address;
        addr_ = s.str ();
        return 0;
    }
    addr_.clear ();
    return -1;
}